

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bool.cpp
# Opt level: O0

AggregateFunction * duckdb::BoolAndFun::GetFunction(void)

{
  AggregateFunction *in_RDI;
  AggregateFunction *fun;
  FunctionNullHandling in_stack_000000af;
  LogicalType *in_stack_000000b0;
  LogicalType *in_stack_000000b8;
  AggregateFunction *pAVar1;
  LogicalType local_40 [24];
  LogicalType local_28 [31];
  undefined1 local_9;
  
  local_9 = 0;
  pAVar1 = in_RDI;
  duckdb::LogicalType::LogicalType(local_28,BOOLEAN);
  duckdb::LogicalType::LogicalType(local_40,BOOLEAN);
  AggregateFunction::
  UnaryAggregate<duckdb::BoolState,bool,bool,duckdb::BoolAndFunFunction,(duckdb::AggregateDestructorType)0>
            (in_stack_000000b8,in_stack_000000b0,in_stack_000000af);
  duckdb::LogicalType::~LogicalType(local_40);
  duckdb::LogicalType::~LogicalType(local_28);
  pAVar1->order_dependent = NOT_ORDER_DEPENDENT;
  pAVar1->distinct_dependent = NOT_DISTINCT_DEPENDENT;
  return in_RDI;
}

Assistant:

AggregateFunction BoolAndFun::GetFunction() {
	auto fun = AggregateFunction::UnaryAggregate<BoolState, bool, bool, BoolAndFunFunction>(
	    LogicalType(LogicalTypeId::BOOLEAN), LogicalType::BOOLEAN);
	fun.order_dependent = AggregateOrderDependent::NOT_ORDER_DEPENDENT;
	fun.distinct_dependent = AggregateDistinctDependent::NOT_DISTINCT_DEPENDENT;
	return fun;
}